

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs_signal.cpp
# Opt level: O1

set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_> *
__thiscall
CsSignal::SignalBase::internal_receiverList
          (set<CsSignal::SlotBase_*,_std::less<CsSignal::SlotBase_*>,_std::allocator<CsSignal::SlotBase_*>_>
           *__return_storage_ptr__,SignalBase *this,BentoAbstract *signalMethod_Bento)

{
  _Rb_tree_header *p_Var1;
  undefined1 *puVar2;
  char cVar3;
  zombie_list_node *pzVar4;
  __pointer_type pzVar5;
  __pointer_type pzVar6;
  zombie_list_node *extraout_RDX;
  long *plVar7;
  bool bVar8;
  pair<std::_Rb_tree_iterator<CsSignal::SlotBase_*>,_bool> pVar9;
  read_handle senderListHandle;
  read_handle local_48;
  SlotBase *local_28;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48.m_ptr = &(this->m_connectList).m_obj;
  local_48.m_accessed = false;
  local_48.m_guard.m_list = local_48.m_ptr;
  pzVar4 = (zombie_list_node *)operator_new(0x18);
  (pzVar4->next)._M_b._M_p = (__pointer_type)0x0;
  (pzVar4->owner)._M_b._M_p = &local_48.m_guard;
  pzVar4->zombie_node = (node *)0x0;
  pzVar6 = *(__pointer_type *)&(this->m_connectList).field_0x10;
  do {
    (pzVar4->next)._M_b._M_p = pzVar6;
    puVar2 = &(this->m_connectList).field_0x10;
    LOCK();
    pzVar5 = *(__pointer_type *)puVar2;
    bVar8 = pzVar6 == pzVar5;
    if (bVar8) {
      *(zombie_list_node **)puVar2 = pzVar4;
      pzVar5 = pzVar6;
    }
    UNLOCK();
    pzVar6 = pzVar5;
  } while (!bVar8);
  local_48.m_accessed = true;
  plVar7 = *(long **)local_48.m_ptr;
  local_48.m_guard.m_zombie = pzVar4;
  if (plVar7 != (long *)0x0) {
    do {
      cVar3 = (**(code **)(*(long *)plVar7[3] + 0x10))((long *)plVar7[3],signalMethod_Bento,pzVar4);
      pzVar4 = extraout_RDX;
      if (cVar3 != '\0') {
        local_28 = (SlotBase *)plVar7[4];
        pVar9 = std::
                _Rb_tree<CsSignal::SlotBase*,CsSignal::SlotBase*,std::_Identity<CsSignal::SlotBase*>,std::less<CsSignal::SlotBase*>,std::allocator<CsSignal::SlotBase*>>
                ::_M_insert_unique<CsSignal::SlotBase*>
                          ((_Rb_tree<CsSignal::SlotBase*,CsSignal::SlotBase*,std::_Identity<CsSignal::SlotBase*>,std::less<CsSignal::SlotBase*>,std::allocator<CsSignal::SlotBase*>>
                            *)__return_storage_ptr__,&local_28);
        pzVar4 = pVar9._8_8_;
      }
      plVar7 = (long *)*plVar7;
    } while (plVar7 != (long *)0x0);
  }
  libguarded::
  rcu_guarded<libguarded::rcu_list<CsSignal::SignalBase::ConnectStruct,_std::mutex,_std::allocator<CsSignal::SignalBase::ConnectStruct>_>_>
  ::read_handle::~read_handle(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::set<CsSignal::SlotBase *> CsSignal::SignalBase::internal_receiverList(
                  const Internal::BentoAbstract &signalMethod_Bento) const
{
   std::set<SlotBase *> retval;

   auto senderListHandle = m_connectList.lock_read();

   for (auto &item : *senderListHandle) {

      if (*(item.signalMethod) != signalMethod_Bento)  {
         continue;
      }

      retval.insert(const_cast<SlotBase *>(item.receiver));
   }

   return retval;
}